

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rootindexproxymodel.cpp
# Opt level: O1

void RootIndexProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  RootIndexProxyModel *_t;
  QModelIndex local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 0) {
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      puVar1 = (undefined8 *)*_a;
      rootIndex(&local_28,(RootIndexProxyModel *)_o);
      puVar1[2] = local_28.m;
      *puVar1 = local_28._0_8_;
      puVar1[1] = local_28.i;
      return;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      setRootIndex((RootIndexProxyModel *)_o,(QModelIndex *)*_a);
      return;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == rootIndexChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  return;
}

Assistant:

void RootIndexProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->rootIndexChanged(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (RootIndexProxyModel::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&RootIndexProxyModel::rootIndexChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QModelIndex*>(_v) = _t->rootIndex(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<RootIndexProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRootIndex(*reinterpret_cast< QModelIndex*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_a;
}